

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::testGroupStarting(TeamCityReporter *this,GroupInfo *groupInfo)

{
  ostream *poVar1;
  string sStack_38;
  
  LazyStat<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::TeamCityReporter>).currentGroupInfo,
             groupInfo);
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::TeamCityReporter>).stream,
                           "##teamcity[testSuiteStarted name=\'");
  escape(&sStack_38,&groupInfo->name);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void testGroupStarting( GroupInfo const& groupInfo ) override {
            StreamingReporterBase::testGroupStarting( groupInfo );
            stream << "##teamcity[testSuiteStarted name='"
                << escape( groupInfo.name ) << "']\n";
        }